

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void * xmalloc(size_t size)

{
  void *pvVar1;
  void *result;
  size_t size_local;
  
  result = (void *)size;
  if (size == 0) {
    result = (void *)0x1;
  }
  pvVar1 = malloc((size_t)result);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Out of memory - unable to allocate %lu bytes",result);
    abort();
  }
  return pvVar1;
}

Assistant:

void *xmalloc(size_t size)
{
	if (size == 0) {
		size = 1;
	}
	void *result = malloc(size);
	if (result == NULL) {
		fprintf(stderr, "Out of memory - unable to allocate %lu bytes", size);
		abort();
	}
	return result;
}